

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  cmGlobalGenerator *gg;
  string *psVar6;
  ostream *poVar7;
  char *pcVar8;
  FILE *__stream;
  size_t sVar9;
  bool in_DL;
  uint uVar10;
  ulong uVar11;
  char *c;
  cmWorkingDirectory *pcVar12;
  string destPath;
  string modulesPath;
  string resultFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string inFile;
  string outFile;
  string cwd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  string value;
  int local_1018;
  
  resultFile._M_dataplus._M_p = (pointer)&resultFile.field_2;
  resultFile._M_string_length = 0;
  resultFile.field_2._M_local_buf[0] = '\0';
  iVar4 = 1;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&cwd,(SystemTools *)0x1,in_DL);
  std::operator+(&destPath,&cwd,"/__cmake_systeminformation");
  cmsys::SystemTools::RemoveADirectory(&destPath);
  bVar2 = cmsys::SystemTools::MakeDirectory(&destPath,(mode_t *)0x0);
  if (bVar2) {
    bVar2 = true;
    uVar11 = 1;
    while( true ) {
      uVar10 = (uint)uVar11;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar11)
      break;
      psVar6 = pbVar1 + uVar11;
      lVar5 = std::__cxx11::string::find((char *)psVar6,0x44d7fe);
      if (lVar5 == 0) {
        std::__cxx11::string::substr((ulong)&value,(ulong)psVar6);
        if (value._M_string_length == 0) {
          uVar10 = uVar10 + 1;
          if ((ulong)uVar10 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&value);
            goto LAB_001ac6cb;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&modulesPath,"No generator specified for -G",
                     (allocator<char> *)&inFile);
          cmSystemTools::Error(&modulesPath);
          std::__cxx11::string::~string((string *)&modulesPath);
          PrintGeneratorList(this);
          bVar3 = false;
        }
        else {
LAB_001ac6cb:
          gg = CreateGlobalGenerator(this,&value);
          if (gg == (cmGlobalGenerator *)0x0) {
            std::operator+(&modulesPath,"Could not create named generator ",&value);
            cmSystemTools::Error(&modulesPath);
            std::__cxx11::string::~string((string *)&modulesPath);
            bVar3 = true;
            PrintGeneratorList(this);
          }
          else {
            bVar3 = true;
            SetGlobalGenerator(this,gg);
          }
        }
        std::__cxx11::string::~string((string *)&value);
        if (!bVar3) {
          iVar4 = -1;
          goto LAB_001aca8b;
        }
      }
      else {
        bVar2 = cmsys::SystemTools::FileIsFullPath(psVar6);
        if (!bVar2) {
          std::__cxx11::string::_M_assign((string *)&resultFile);
          std::__cxx11::string::append((char *)&resultFile);
        }
        std::__cxx11::string::append((string *)&resultFile);
        bVar2 = false;
      }
      uVar11 = (ulong)(uVar10 + 1);
    }
    AddCMakePaths(this);
    psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    std::__cxx11::string::string((string *)&modulesPath,(string *)psVar6);
    std::__cxx11::string::append((char *)&modulesPath);
    std::__cxx11::string::string((string *)&inFile,(string *)&modulesPath);
    std::__cxx11::string::append((char *)&inFile);
    std::__cxx11::string::string((string *)&outFile,(string *)&destPath);
    std::__cxx11::string::append((char *)&outFile);
    bVar3 = cmsys::SystemTools::CopyFileAlways(&inFile,&outFile);
    if (bVar3) {
      if (resultFile._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&resultFile);
        std::__cxx11::string::append((char *)&resultFile);
      }
      cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)&value,&destPath);
      if (local_1018 == 0) {
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&args2,(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&args2,&destPath);
        std::operator+(&local_1058,"-DRESULT_FILE=",&resultFile);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args2,
                   &local_1058);
        std::__cxx11::string::~string((string *)&local_1058);
        iVar4 = Run(this,&args2,false);
        bVar3 = iVar4 == 0;
        if (bVar3) {
          iVar4 = -1;
        }
        else {
          std::operator<<((ostream *)&std::cerr,
                          "Error: --system-information failed on internal CMake!\n");
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args2);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to change to directory ");
        poVar7 = std::operator<<(poVar7,(string *)&destPath);
        poVar7 = std::operator<<(poVar7," : ");
        pcVar8 = strerror(local_1018);
        poVar7 = std::operator<<(poVar7,pcVar8);
        std::endl<char,std::char_traits<char>>(poVar7);
        iVar4 = 1;
        bVar3 = false;
      }
      cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&value);
      if (bVar3) {
        if ((bVar2) &&
           (__stream = (FILE *)cmsys::SystemTools::Fopen(&resultFile,"r"), __stream != (FILE *)0x0))
        {
          while (sVar9 = fread((cmWorkingDirectory *)&value,1,0x1000,__stream), sVar9 != 0) {
            for (pcVar12 = (cmWorkingDirectory *)&value;
                pcVar12 < (cmWorkingDirectory *)((long)&value._M_dataplus._M_p + sVar9);
                pcVar12 = (cmWorkingDirectory *)((long)&(pcVar12->OldDir)._M_dataplus._M_p + 1)) {
              putc((int)*(char *)&(pcVar12->OldDir)._M_dataplus._M_p,_stdout);
            }
            fflush(_stdout);
          }
          fclose(__stream);
        }
        iVar4 = 0;
        cmsys::SystemTools::RemoveADirectory(&destPath);
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error copying file \"");
      poVar7 = std::operator<<(poVar7,(string *)&inFile);
      poVar7 = std::operator<<(poVar7,"\" to \"");
      poVar7 = std::operator<<(poVar7,(string *)&outFile);
      std::operator<<(poVar7,"\".\n");
      iVar4 = 1;
    }
    std::__cxx11::string::~string((string *)&outFile);
    std::__cxx11::string::~string((string *)&inFile);
    std::__cxx11::string::~string((string *)&modulesPath);
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Error: --system-information must be run from a writable directory!\n");
  }
LAB_001aca8b:
  std::__cxx11::string::~string((string *)&destPath);
  std::__cxx11::string::~string((string *)&cwd);
  std::__cxx11::string::~string((string *)&resultFile);
  return iVar4;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath)) {
    std::cerr << "Error: --system-information must be run from a "
                 "writable directory!\n";
    return 1;
  }

  // process the arguments
  bool writeToStdout = true;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator " + value);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the output file
    else {
      if (!cmSystemTools::FileIsFullPath(arg)) {
        resultFile = cwd;
        resultFile += "/";
      }
      resultFile += arg;
      writeToStdout = false;
    }
  }

  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath = cmSystemTools::GetCMakeRoot();
  modulesPath += "/Modules";
  std::string inFile = modulesPath;
  inFile += "/SystemInformation.cmake";
  std::string outFile = destPath;
  outFile += "/CMakeLists.txt";

  // Copy file
  if (!cmsys::SystemTools::CopyFileAlways(inFile, outFile)) {
    std::cerr << "Error copying file \"" << inFile << "\" to \"" << outFile
              << "\".\n";
    return 1;
  }

  // do we write to a file or to stdout?
  if (resultFile.empty()) {
    resultFile = cwd;
    resultFile += "/__cmake_systeminformation/results.txt";
  }

  {
    // now run cmake on the CMakeLists file
    cmWorkingDirectory workdir(destPath);
    if (workdir.Failed()) {
      // We created the directory and we were able to copy the CMakeLists.txt
      // file to it, so we wouldn't expect to get here unless the default
      // permissions are questionable or some other process has deleted the
      // directory
      std::cerr << "Failed to change to directory " << destPath << " : "
                << std::strerror(workdir.GetLastResult()) << std::endl;
      return 1;
    }
    std::vector<std::string> args2;
    args2.push_back(args[0]);
    args2.push_back(destPath);
    args2.push_back("-DRESULT_FILE=" + resultFile);
    int res = this->Run(args2, false);

    if (res != 0) {
      std::cerr << "Error: --system-information failed on internal CMake!\n";
      return res;
    }
  }

  // echo results to stdout if needed
  if (writeToStdout) {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if (fin) {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while ((n = fread(buffer, 1, bufferSize, fin)) > 0) {
        for (char* c = buffer; c < buffer + n; ++c) {
          putc(*c, stdout);
        }
        fflush(stdout);
      }
      fclose(fin);
    }
  }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}